

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzDoubleMod_fast(word *b,word *a,word *mod,size_t n)

{
  ulong uVar1;
  int iVar2;
  ulong in_RCX;
  word *in_RDX;
  long in_RSI;
  word *in_RDI;
  size_t i;
  word hi;
  word carry;
  ulong local_38;
  ulong local_28;
  
  local_28 = 0;
  for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
    uVar1 = *(ulong *)(in_RSI + local_38 * 8);
    in_RDI[local_38] = *(long *)(in_RSI + local_38 * 8) << 1 | local_28;
    local_28 = uVar1 >> 0x3f;
  }
  if ((local_28 == 0) && (iVar2 = wwCmp(in_RDI,in_RDX,in_RCX), iVar2 < 0)) {
    return;
  }
  zzSub2(in_RDI,in_RDX,in_RCX);
  return;
}

Assistant:

void FAST(zzDoubleMod)(word b[], const word a[], const word mod[], size_t n)
{
	register word carry = 0;
	register word hi;
	size_t i;
	// pre
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	// b <- a * 2
	for (i = 0; i < n; ++i)
		hi = a[i] >> (B_PER_W - 1),
		b[i] = a[i] << 1 | carry,
		carry = hi;
	// sub mod
	if (carry || wwCmp(b, mod, n) >= 0)
		zzSub2(b, mod, n);
	// очистка
	hi = carry = 0;
}